

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightbuffer.cpp
# Opt level: O0

void __thiscall FLightBuffer::FLightBuffer(FLightBuffer *this)

{
  float *pfVar1;
  FLightBuffer *this_local;
  
  TArray<int,_int>::TArray(&this->mIndices);
  this->mBufferSize = 160000;
  this->mByteSize = this->mBufferSize << 2;
  if ((gl.flags & 4) == 0) {
    this->mBufferType = 0x8a11;
    this->mBlockSize = gl.maxuniformblock >> 4;
    if (0x800 < this->mBlockSize) {
      this->mBlockSize = 0x800;
    }
    this->mBlockAlign = this->mBlockSize >> 1;
  }
  else {
    this->mBufferType = 0x90d2;
    this->mBlockAlign = 0;
    this->mBlockSize = this->mBufferSize;
  }
  (*_ptrc_glGenBuffers)(1,&this->mBufferId);
  (*_ptrc_glBindBufferBase)(this->mBufferType,1,this->mBufferId);
  (*_ptrc_glBindBuffer)(this->mBufferType,this->mBufferId);
  if (gl.lightmethod == 2) {
    (*_ptrc_glBufferStorage)(this->mBufferType,(GLsizeiptr)this->mByteSize,(void *)0x0,0xc2);
    pfVar1 = (float *)(*_ptrc_glMapBufferRange)
                                (this->mBufferType,0,(GLsizeiptr)this->mByteSize,0xc2);
    this->mBufferPointer = pfVar1;
  }
  else {
    (*_ptrc_glBufferData)(this->mBufferType,(GLsizeiptr)this->mByteSize,(void *)0x0,0x88e8);
    this->mBufferPointer = (float *)0x0;
  }
  Clear(this);
  this->mLastMappedIndex = 0xffffffff;
  return;
}

Assistant:

FLightBuffer::FLightBuffer()
{

	mBufferSize = INITIAL_BUFFER_SIZE;
	mByteSize = mBufferSize * sizeof(float);
	if (gl.flags & RFL_SHADER_STORAGE_BUFFER)
	{
		mBufferType = GL_SHADER_STORAGE_BUFFER;
		mBlockAlign = 0;
		mBlockSize = mBufferSize;
	}
	else
	{
		mBufferType = GL_UNIFORM_BUFFER;
		mBlockSize = gl.maxuniformblock / 16;
		if (mBlockSize > 2048) mBlockSize = 2048;	// we don't really need a larger buffer
		mBlockAlign = mBlockSize / 2;
	}

	glGenBuffers(1, &mBufferId);
	glBindBufferBase(mBufferType, LIGHTBUF_BINDINGPOINT, mBufferId);
	glBindBuffer(mBufferType, mBufferId);	// Note: Some older AMD drivers don't do that in glBindBufferBase, as they should.
	if (gl.lightmethod == LM_DIRECT)
	{
		glBufferStorage(mBufferType, mByteSize, NULL, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		mBufferPointer = (float*)glMapBufferRange(mBufferType, 0, mByteSize, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
	}
	else
	{
		glBufferData(mBufferType, mByteSize, NULL, GL_DYNAMIC_DRAW);
		mBufferPointer = NULL;
	}

	Clear();
	mLastMappedIndex = UINT_MAX;
}